

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::writeBasis(Highs *this,string *filename)

{
  HighsLogOptions *log_options_;
  bool bVar1;
  HighsStatus HVar2;
  allocator local_f1;
  FILE *file;
  HighsFileType file_type;
  string local_e0;
  string local_c0;
  string local_a0;
  HighsLogOptions local_80;
  
  std::__cxx11::string::string((string *)&local_a0,(string *)filename);
  std::__cxx11::string::string((string *)&local_c0,"writebasis",(allocator *)&local_e0);
  HVar2 = openWriteFile(this,&local_a0,&local_c0,&file,&file_type);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
  HighsLogOptions::HighsLogOptions(&local_80,log_options_);
  std::__cxx11::string::string((string *)&local_e0,"openWriteFile",&local_f1);
  HVar2 = interpretCallStatus(&local_80,HVar2,kOk,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::_Function_base::~_Function_base(&local_80.user_callback.super__Function_base);
  if (HVar2 != kError) {
    bVar1 = std::operator!=(filename,"");
    if (bVar1) {
      highsLogUser(log_options_,kInfo,"Writing the basis to %s\n",(filename->_M_dataplus)._M_p);
    }
    writeBasisFile(&file,&this->basis_);
    if (file != _stdout) {
      fclose((FILE *)file);
    }
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::writeBasis(const std::string& filename) const {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  FILE* file;
  HighsFileType file_type;
  call_status = openWriteFile(filename, "writebasis", file, file_type);
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "openWriteFile");
  if (return_status == HighsStatus::kError) return return_status;
  // Report to user that basis is being written
  if (filename != "")
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the basis to %s\n", filename.c_str());
  writeBasisFile(file, basis_);
  if (file != stdout) fclose(file);
  return return_status;
}